

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void set_sgb_palette(Emulator *e,int pal,u8 lo0,u8 hi0,u8 lo1,u8 hi1,u8 lo2,u8 hi2,u8 lo3,u8 hi3)

{
  PaletteRGBA *pPVar1;
  CgbColorCurve CVar2;
  undefined8 uVar3;
  int i;
  RGBA RVar4;
  PaletteRGBA *pPVar5;
  long lVar6;
  undefined7 in_register_00000011;
  long lVar7;
  
  CVar2 = e->cgb_color_curve;
  RVar4 = unpack_cgb_color((Emulator *)(ulong)CVar2,
                           (ushort)hi0 * 0x100 + (short)CONCAT71(in_register_00000011,lo0));
  pPVar1 = (e->state).sgb.screen_pal;
  lVar6 = 0;
  do {
    *(RGBA *)((long)pPVar1->color + lVar6) = RVar4;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  RVar4 = unpack_cgb_color((Emulator *)(ulong)CVar2,CONCAT11(hi1,lo1));
  (e->state).sgb.screen_pal[pal].color[1] = RVar4;
  CVar2 = e->cgb_color_curve;
  RVar4 = unpack_cgb_color((Emulator *)(ulong)CVar2,CONCAT11(hi2,lo2));
  (e->state).sgb.screen_pal[pal].color[2] = RVar4;
  RVar4 = unpack_cgb_color((Emulator *)(ulong)CVar2,CONCAT11(hi3,lo3));
  (e->state).sgb.screen_pal[pal].color[3] = RVar4;
  if (pal == 0) {
    uVar3 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
    *(undefined8 *)e->color_to_rgba[1].color = *(undefined8 *)pPVar1->color;
    *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar3;
    lVar6 = 0;
    do {
      e->pal[1].color[lVar6] = e->color_to_rgba[1].color[(e->state).ppu.pal[1].color[lVar6]];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    uVar3 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
    *(undefined8 *)e->color_to_rgba[2].color = *(undefined8 *)pPVar1->color;
    *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar3;
    lVar6 = 0;
    do {
      e->sgb_pal[-1].color[lVar6] =
           e->pal[-1].color[*(uint *)((long)((e->state).ppu.bgcp.palettes + -1) + lVar6 * 4)];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
  }
  lVar6 = 0;
  do {
    e->pal[0].color[lVar6] = e->color_to_rgba[0].color[(e->state).ppu.pal[0].color[lVar6]];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pPVar5 = e->sgb_pal;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      pPVar5->color[lVar7] = pPVar1[lVar6].color[(e->state).ppu.pal[0].color[lVar7]];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    pPVar5 = pPVar5 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

static void set_sgb_palette(Emulator* e, int pal, u8 lo0, u8 hi0, u8 lo1,
                               u8 hi1, u8 lo2, u8 hi2, u8 lo3, u8 hi3) {
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i].color[0] = unpack_cgb_color8(e, lo0, hi0);
  }
  SGB.screen_pal[pal].color[1] = unpack_cgb_color8(e, lo1, hi1);
  SGB.screen_pal[pal].color[2] = unpack_cgb_color8(e, lo2, hi2);
  SGB.screen_pal[pal].color[3] = unpack_cgb_color8(e, lo3, hi3);
  if (pal == 0) {
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP0, &SGB.screen_pal[0]);
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP1, &SGB.screen_pal[0]);
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}